

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

realtype LBasis(ARKInterp I,int j,realtype t)

{
  realtype p;
  int k;
  realtype t_local;
  int j_local;
  ARKInterp I_local;
  
  p = 1.0;
  for (k = 0; k < *(int *)((long)I->content + 0x18); k = k + 1) {
    if (k != j) {
      p = ((t - *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8)) /
          (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
          *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8))) * p;
    }
  }
  return p;
}

Assistant:

realtype LBasis(ARKInterp I, int j, realtype t)
{
  int k;
  realtype p = ONE;
  for (k=0; k<LINT_NHIST(I); k++) {
    if (k == j) continue;
    p *= (t-LINT_TJ(I,k))/(LINT_TJ(I,j)-LINT_TJ(I,k));
  }
  return(p);
}